

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

ostream * toml::operator<<(ostream *os,basic_value<toml::type_config> *v)

{
  spec s;
  undefined1 auVar1 [12];
  long lVar3;
  ushort uStack_32;
  string_type local_30;
  undefined1 auVar2 [16];
  
  lVar3 = (ulong)uStack_32 << 0x30;
  auVar2 = ZEXT816(1);
  s.v1_1_0_add_escape_sequence_e = (bool)(char)lVar3;
  s.v1_1_0_add_escape_sequence_x = (bool)(char)((ulong)lVar3 >> 8);
  s.v1_1_0_make_seconds_optional = (bool)(char)((ulong)lVar3 >> 0x10);
  s.ext_hex_float = (bool)(char)((ulong)lVar3 >> 0x18);
  s.ext_num_suffix = (bool)(char)((ulong)lVar3 >> 0x20);
  s.ext_null_value = (bool)(char)((ulong)lVar3 >> 0x28);
  s._22_2_ = (short)((ulong)lVar3 >> 0x30);
  auVar1 = auVar2._0_12_;
  s.version.major = auVar1._0_4_;
  s.version.minor = auVar1._4_4_;
  s.version.patch = auVar1._8_4_;
  s.v1_1_0_allow_control_characters_in_comments = (bool)auVar2[0xc];
  s.v1_1_0_allow_newlines_in_inline_tables = (bool)auVar2[0xd];
  s.v1_1_0_allow_trailing_comma_in_inline_tables = (bool)auVar2[0xe];
  s.v1_1_0_allow_non_english_in_bare_keys = (bool)auVar2[0xf];
  format<toml::type_config>(&local_30,v,s);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const basic_value<TC>& v)
{
    os << format(v);
    return os;
}